

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Fx_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nNewNodesMax,int LitCountMax,int fCanonDivs,
                  int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  abctime aVar2;
  Fx_Man_t *p_00;
  abctime aVar3;
  float fVar4;
  abctime clk;
  Fx_Man_t *p;
  int local_30;
  int fWarning;
  int iDiv;
  int i;
  int fVeryVeryVerbose;
  int fVerbose_local;
  int fCanonDivs_local;
  int LitCountMax_local;
  int nNewNodesMax_local;
  int ObjIdMax_local;
  Vec_Wec_t *vCubes_local;
  
  iDiv = 0;
  p._4_4_ = 0;
  i = fVerbose;
  fVeryVeryVerbose = fCanonDivs;
  fVerbose_local = LitCountMax;
  fCanonDivs_local = nNewNodesMax;
  LitCountMax_local = ObjIdMax;
  _nNewNodesMax_local = vCubes;
  aVar2 = Abc_Clock();
  p_00 = Fx_ManStart(_nNewNodesMax_local);
  p_00->LitCountMax = fVerbose_local;
  p_00->fCanonDivs = fVeryVeryVerbose;
  Fx_ManCreateLiterals(p_00,LitCountMax_local);
  Fx_ManComputeLevel(p_00);
  Fx_ManCreateDivisors(p_00);
  if (fVeryVerbose != 0) {
    Fx_PrintMatrix(p_00);
  }
  if (i != 0) {
    aVar3 = Abc_Clock();
    Fx_PrintStats(p_00,aVar3 - aVar2);
  }
  aVar3 = Abc_Clock();
  p_00->timeStart = aVar3;
  fWarning = 0;
  while( true ) {
    bVar1 = false;
    if (fWarning < fCanonDivs_local) {
      fVar4 = Vec_QueTopPriority(p_00->vPrio);
      bVar1 = 0.0 < fVar4;
    }
    if (!bVar1) break;
    local_30 = Vec_QuePop(p_00->vPrio);
    if (fVeryVerbose != 0) {
      Fx_PrintDiv(p_00,local_30);
    }
    Fx_ManUpdate(p_00,local_30,(int *)((long)&p + 4));
    if (iDiv != 0) {
      Fx_PrintMatrix(p_00);
    }
    fWarning = fWarning + 1;
  }
  if (i != 0) {
    aVar3 = Abc_Clock();
    Fx_PrintStats(p_00,aVar3 - aVar2);
  }
  Fx_ManStop(p_00);
  Vec_WecRemoveEmpty(_nNewNodesMax_local);
  return 1;
}

Assistant:

int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    int fVeryVeryVerbose = 0;
    int i, iDiv, fWarning = 0;
    Fx_Man_t * p;
    abctime clk = Abc_Clock();
    // initialize the data-structure
    p = Fx_ManStart( vCubes );
    p->LitCountMax = LitCountMax;
    p->fCanonDivs = fCanonDivs;
    Fx_ManCreateLiterals( p, ObjIdMax );
    Fx_ManComputeLevel( p );
    Fx_ManCreateDivisors( p );
    if ( fVeryVerbose )
        Fx_PrintMatrix( p );
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    // perform extraction
    p->timeStart = Abc_Clock();
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vPrio) > 0.0; i++ )
    {
        iDiv = Vec_QuePop(p->vPrio);
        if ( fVeryVerbose )
            Fx_PrintDiv( p, iDiv );
        Fx_ManUpdate( p, iDiv, &fWarning );
        if ( fVeryVeryVerbose )
            Fx_PrintMatrix( p );
    }
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    Fx_ManStop( p );
    // return the result
    Vec_WecRemoveEmpty( vCubes );
    return 1;
}